

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.h
# Opt level: O0

void __thiscall BasePort::BroadcastReadInfo::BroadcastReadInfo(BroadcastReadInfo *this)

{
  BroadcastBoardInfo *local_28;
  BroadcastReadInfo *this_local;
  
  this->readSizeQuads = 0;
  this->readSequence = 0;
  this->updateStartTime = 0.0;
  this->updateFinishTime = 0.0;
  this->updateOverflow = false;
  this->readStartTime = 0.0;
  this->readFinishTime = 0.0;
  this->readOverflow = false;
  this->gapTime = 0.0;
  local_28 = this->boardInfo;
  do {
    BroadcastBoardInfo::BroadcastBoardInfo(local_28);
    local_28 = local_28 + 1;
  } while ((BroadcastReadInfo *)local_28 != this + 1);
  Clear(this);
  return;
}

Assistant:

BroadcastReadInfo() : readSizeQuads(0), readSequence(0), updateStartTime(0.0), updateFinishTime(0.0),
                              updateOverflow(false), readStartTime(0.0), readFinishTime(0.0), readOverflow(false),
                              gapTime(0.0) { Clear(); }